

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O2

__m128i convolve_lo_x(__m128i *s,__m128i *coeffs)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  __m128i alVar39;
  __m128i ss [4];
  __m128i local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  alVar39 = *s;
  auVar4[0xd] = 0;
  auVar4._0_13_ = alVar39._0_13_;
  auVar4[0xe] = alVar39[0]._7_1_;
  auVar8[0xc] = alVar39[0]._6_1_;
  auVar8._0_12_ = alVar39._0_12_;
  auVar8._13_2_ = auVar4._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = alVar39._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16[10] = alVar39[0]._5_1_;
  auVar16._0_10_ = alVar39._0_10_;
  auVar16._11_4_ = auVar12._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = alVar39._0_9_;
  auVar20._10_5_ = auVar16._10_5_;
  auVar24[8] = alVar39[0]._4_1_;
  auVar24._0_8_ = alVar39[0];
  auVar24._9_6_ = auVar20._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar24._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = alVar39[0]._3_1_;
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = alVar39[0]._2_1_;
  auVar32._11_4_ = 0;
  local_48._3_12_ = SUB1512(auVar32 << 0x20,3);
  local_48[0]._2_1_ = alVar39[0]._1_1_;
  local_48[0]._0_2_ = (ushort)(byte)alVar39[0];
  local_48[1]._7_1_ = 0;
  alVar39 = s[1];
  auVar1[0xd] = 0;
  auVar1._0_13_ = alVar39._0_13_;
  auVar1[0xe] = alVar39[0]._7_1_;
  auVar5[0xc] = alVar39[0]._6_1_;
  auVar5._0_12_ = alVar39._0_12_;
  auVar5._13_2_ = auVar1._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = alVar39._0_11_;
  auVar9._12_3_ = auVar5._12_3_;
  auVar13[10] = alVar39[0]._5_1_;
  auVar13._0_10_ = alVar39._0_10_;
  auVar13._11_4_ = auVar9._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = alVar39._0_9_;
  auVar17._10_5_ = auVar13._10_5_;
  auVar21[8] = alVar39[0]._4_1_;
  auVar21._0_8_ = alVar39[0];
  auVar21._9_6_ = auVar17._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar21._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = alVar39[0]._3_1_;
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = alVar39[0]._2_1_;
  auVar34._11_4_ = 0;
  auVar25[2] = alVar39[0]._1_1_;
  auVar25._0_2_ = (ushort)alVar39[0];
  auVar25._3_12_ = SUB1512(auVar34 << 0x20,3);
  local_38._0_2_ = (ushort)alVar39[0] & 0xff;
  local_38._2_13_ = auVar25._2_13_;
  local_38[0xf] = 0;
  alVar39 = s[2];
  auVar2[0xd] = 0;
  auVar2._0_13_ = alVar39._0_13_;
  auVar2[0xe] = alVar39[0]._7_1_;
  auVar6[0xc] = alVar39[0]._6_1_;
  auVar6._0_12_ = alVar39._0_12_;
  auVar6._13_2_ = auVar2._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = alVar39._0_11_;
  auVar10._12_3_ = auVar6._12_3_;
  auVar14[10] = alVar39[0]._5_1_;
  auVar14._0_10_ = alVar39._0_10_;
  auVar14._11_4_ = auVar10._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = alVar39._0_9_;
  auVar18._10_5_ = auVar14._10_5_;
  auVar22[8] = alVar39[0]._4_1_;
  auVar22._0_8_ = alVar39[0];
  auVar22._9_6_ = auVar18._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar22._8_7_;
  auVar35._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar35[0] = alVar39[0]._3_1_;
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = alVar39[0]._2_1_;
  auVar36._11_4_ = 0;
  local_28._3_12_ = SUB1512(auVar36 << 0x20,3);
  local_28[2] = alVar39[0]._1_1_;
  local_28[0] = (byte)alVar39[0];
  local_28[1] = 0;
  local_28[0xf] = 0;
  alVar39 = s[3];
  auVar3[0xd] = 0;
  auVar3._0_13_ = alVar39._0_13_;
  auVar3[0xe] = alVar39[0]._7_1_;
  auVar7[0xc] = alVar39[0]._6_1_;
  auVar7._0_12_ = alVar39._0_12_;
  auVar7._13_2_ = auVar3._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = alVar39._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15[10] = alVar39[0]._5_1_;
  auVar15._0_10_ = alVar39._0_10_;
  auVar15._11_4_ = auVar11._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = alVar39._0_9_;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = alVar39[0]._4_1_;
  auVar23._0_8_ = alVar39[0];
  auVar23._9_6_ = auVar19._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar23._8_7_;
  auVar37._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar37[0] = alVar39[0]._3_1_;
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = alVar39[0]._2_1_;
  auVar38._11_4_ = 0;
  auVar26[2] = alVar39[0]._1_1_;
  auVar26._0_2_ = (ushort)alVar39[0];
  auVar26._3_12_ = SUB1512(auVar38 << 0x20,3);
  local_18._0_2_ = (ushort)alVar39[0] & 0xff;
  local_18._2_13_ = auVar26._2_13_;
  local_18[0xf] = 0;
  alVar39 = convolve(&local_48,coeffs);
  alVar39[0] = alVar39[0];
  alVar39[1] = alVar39[1];
  return alVar39;
}

Assistant:

static inline __m128i convolve_lo_x(const __m128i *const s,
                                    const __m128i *const coeffs) {
  __m128i ss[4];
  ss[0] = _mm_unpacklo_epi8(s[0], _mm_setzero_si128());
  ss[1] = _mm_unpacklo_epi8(s[1], _mm_setzero_si128());
  ss[2] = _mm_unpacklo_epi8(s[2], _mm_setzero_si128());
  ss[3] = _mm_unpacklo_epi8(s[3], _mm_setzero_si128());
  return convolve(ss, coeffs);
}